

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_free(REF_GEOM ref_geom)

{
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_GEOM ref_geom_local;
  
  if (ref_geom == (REF_GEOM)0x0) {
    ref_geom_local._4_4_ = 2;
  }
  else {
    ref_facelift_free(ref_geom->ref_facelift);
    if (ref_geom->cad_data != (REF_BYTE *)0x0) {
      free(ref_geom->cad_data);
    }
    if (ref_geom->e2f != (REF_INT *)0x0) {
      free(ref_geom->e2f);
    }
    if ((ref_geom->contex_owned == 0) ||
       (ref_geom_local._4_4_ = ref_egads_close(ref_geom), ref_geom_local._4_4_ == 0)) {
      ref_geom_local._4_4_ = ref_adj_free(ref_geom->ref_adj);
      if (ref_geom_local._4_4_ == 0) {
        if (ref_geom->face_seg_per_rad != (REF_DBL *)0x0) {
          free(ref_geom->face_seg_per_rad);
        }
        if (ref_geom->face_min_length != (REF_DBL *)0x0) {
          free(ref_geom->face_min_length);
        }
        if (ref_geom->initial_cell_height != (REF_DBL *)0x0) {
          free(ref_geom->initial_cell_height);
        }
        if (ref_geom->uv_area_sign != (REF_DBL *)0x0) {
          free(ref_geom->uv_area_sign);
        }
        if (ref_geom->param != (REF_DBL *)0x0) {
          free(ref_geom->param);
        }
        if (ref_geom->descr != (REF_INT *)0x0) {
          free(ref_geom->descr);
        }
        if (ref_geom != (REF_GEOM)0x0) {
          free(ref_geom);
        }
        ref_geom_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x79
               ,"ref_geom_free",(ulong)ref_geom_local._4_4_,"adj free");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x78,
             "ref_geom_free",(ulong)ref_geom_local._4_4_,"close egads contex");
    }
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_free(REF_GEOM ref_geom) {
  if (NULL == (void *)ref_geom) return REF_NULL;
  ref_facelift_free(ref_geom_facelift(ref_geom));
  ref_free(ref_geom->cad_data);
  ref_free(ref_geom->e2f);
  if (ref_geom->contex_owned)
    RSS(ref_egads_close(ref_geom), "close egads contex");
  RSS(ref_adj_free(ref_geom->ref_adj), "adj free");
  ref_free(ref_geom->face_seg_per_rad);
  ref_free(ref_geom->face_min_length);
  ref_free(ref_geom->initial_cell_height);
  ref_free(ref_geom->uv_area_sign);
  ref_free(ref_geom->param);
  ref_free(ref_geom->descr);
  ref_free(ref_geom);
  return REF_SUCCESS;
}